

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

void add_pax_attr_int(archive_string *as,char *key,int64_t value)

{
  char *in_RDX;
  archive_string *in_RSI;
  char tmp [25];
  char cVar1;
  undefined7 in_stack_ffffffffffffffe1;
  
  cVar1 = '\0';
  format_int(&stack0xffffffffffffffe0,(int64_t)in_RDX);
  add_pax_attr(in_RSI,in_RDX,(char *)CONCAT71(in_stack_ffffffffffffffe1,cVar1));
  return;
}

Assistant:

static void
add_pax_attr_int(struct archive_string *as, const char *key, int64_t value)
{
	char tmp[1 + 3 * sizeof(value)];

	tmp[sizeof(tmp) - 1] = 0;
	add_pax_attr(as, key, format_int(tmp + sizeof(tmp) - 1, value));
}